

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O2

void __thiscall db_packer::process_file(db_packer *this,string *path)

{
  int iVar1;
  uint uVar2;
  xr_file_system *this_00;
  xr_reader *this_01;
  undefined4 extraout_var;
  size_t size;
  db_file *pdVar3;
  db_file *file;
  
  this_00 = xray_re::xr_file_system::instance();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &this->m_root,path);
  this_01 = xray_re::xr_file_system::r_open(this_00,(char *)file);
  std::__cxx11::string::~string((string *)&file);
  if (this_01 != (xr_reader *)0x0) {
    iVar1 = (*this->m_archive->_vptr_xr_writer[4])();
    size = xray_re::xr_reader::size(this_01);
    uVar2 = crc32(this_01->m_data,size);
    (*this->m_archive->_vptr_xr_writer[2])(this->m_archive,this_01->m_data,size);
    (*this_01->_vptr_xr_reader[1])(this_01);
    pdVar3 = (db_file *)operator_new(0x40);
    (pdVar3->path)._M_dataplus._M_p = (pointer)&(pdVar3->path).field_2;
    (pdVar3->path)._M_string_length = 0;
    (pdVar3->path).field_2._M_local_buf[0] = '\0';
    file = pdVar3;
    std::__cxx11::string::_M_assign((string *)pdVar3);
    pdVar3->crc = uVar2;
    pdVar3->offset = CONCAT44(extraout_var,iVar1);
    pdVar3->size_real = size;
    pdVar3->size_compressed = size;
    std::vector<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>::push_back
              (&this->m_files,&file);
  }
  return;
}

Assistant:

void db_packer::process_file(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(m_root + path);
	if (r) {
		size_t offset = m_archive->tell(), size = r->size();
		uint32_t crc = crc32(r->data(), size);
		m_archive->w_raw(r->data(), size);
		fs.r_close(r);

		db_file* file = new db_file;
		file->path = path;
		file->crc = crc;
		file->offset = offset;
		file->size_real = size;
		file->size_compressed = size;
		m_files.push_back(file);
	}
}